

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_finished(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message)

{
  long lVar1;
  ptls_iovec_t context;
  ulong uVar2;
  long *in_RSI;
  long *in_RDI;
  ptls_iovec_t pVar3;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  int ret;
  uint8_t send_secret [64];
  char *in_stack_000000e0;
  size_t in_stack_00000108;
  int in_stack_00000120;
  uint16_t *in_stack_00000128;
  size_t in_stack_00000130;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ptls_t *in_stack_ffffffffffffff00;
  ptls_buffer_t *in_stack_ffffffffffffff08;
  ptls_key_schedule_t *in_stack_ffffffffffffff10;
  long *plVar4;
  ptls_buffer_t *buf;
  undefined8 in_stack_ffffffffffffff20;
  int iVar5;
  ptls_t *tls_00;
  ptls_iovec_t in_stack_ffffffffffffff30;
  ptls_t *in_stack_ffffffffffffff40;
  int is_enc;
  ptls_t *in_stack_ffffffffffffff48;
  ptls_t *in_stack_ffffffffffffff50;
  ptls_key_schedule_t *in_stack_ffffffffffffff78;
  int local_6c;
  undefined1 local_68 [72];
  long *local_20;
  long *local_18;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  pVar3.len = (size_t)in_stack_ffffffffffffff50;
  pVar3.base = (uint8_t *)in_stack_ffffffffffffff48;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_6c = verify_finished(in_stack_ffffffffffffff40,pVar3);
  if (local_6c == 0) {
    ptls__key_schedule_update_hash
              (in_stack_ffffffffffffff10,(uint8_t *)in_stack_ffffffffffffff08,
               (size_t)in_stack_ffffffffffffff00);
    tls_00 = (ptls_t *)local_18[10];
    pVar3 = ptls_iovec_init((void *)0x0,0);
    local_6c = key_schedule_extract(in_stack_ffffffffffffff78,pVar3);
    if ((local_6c == 0) &&
       (local_6c = setup_traffic_protection
                             (in_stack_ffffffffffffff48,
                              (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                              (char *)in_stack_ffffffffffffff30.len,
                              (size_t)in_stack_ffffffffffffff30.base,(int)((ulong)tls_00 >> 0x20)),
       local_6c == 0)) {
      local_6c = derive_secret((ptls_key_schedule_t *)in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40);
      is_enc = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      if ((local_6c == 0) && (local_6c = derive_exporter_secret(tls_00,iVar5), local_6c == 0)) {
        if (local_18[0x3e] != 0) {
          if ((local_18[0x1f] == 0) && (*(long *)(*local_18 + 0x98) == 0)) {
            __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                          ,0xb84,
                          "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                         );
          }
          if (((*(byte *)(local_18 + 0x34) >> 1 & 1) != 0) &&
             ((*(byte *)(*local_18 + 0x70) >> 4 & 1) == 0)) {
            local_6c = (*(code *)local_20[3])(local_20);
            if (local_6c != 0) goto LAB_0011b20a;
            plVar4 = (long *)*local_20;
            lVar1 = local_18[10];
            local_6c = ptls_buffer__do_pushv
                                 (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            if (local_6c != 0) goto LAB_0011b20a;
            in_stack_ffffffffffffff50 = (ptls_t *)0x3;
            buf = (ptls_buffer_t *)0x3;
            local_6c = ptls_buffer__do_pushv
                                 (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            if (local_6c != 0) goto LAB_0011b20a;
            in_stack_ffffffffffffff48 = (ptls_t *)plVar4[2];
            uVar2 = plVar4[2] - (long)in_stack_ffffffffffffff48;
            if (in_stack_ffffffffffffff50 == (ptls_t *)0xffffffffffffffff) {
              local_6c = ptls_buffer__adjust_quic_blocksize(buf,(size_t)in_stack_ffffffffffffff10);
              if (local_6c != 0) goto LAB_0011b20a;
            }
            else {
              for (; in_stack_ffffffffffffff50 != (ptls_t *)0x0;
                  in_stack_ffffffffffffff50 =
                       (ptls_t *)((long)&in_stack_ffffffffffffff50[-1].data_ptr + 7)) {
                *(char *)((long)in_stack_ffffffffffffff48 +
                         (*plVar4 - (long)in_stack_ffffffffffffff50)) =
                     (char)(uVar2 >> (((char)in_stack_ffffffffffffff50 + -1) * '\b' & 0x3fU));
              }
              in_stack_ffffffffffffff50 = (ptls_t *)0x0;
            }
            is_enc = (int)(uVar2 >> 0x20);
            if (lVar1 != 0) {
              ptls__key_schedule_update_hash
                        (in_stack_ffffffffffffff10,(uint8_t *)in_stack_ffffffffffffff08,
                         (size_t)in_stack_ffffffffffffff00);
            }
            local_6c = (*(code *)local_20[4])(local_20);
            if (local_6c != 0) goto LAB_0011b20a;
          }
          *(byte *)(local_18 + 0x34) = *(byte *)(local_18 + 0x34) & 0xfd;
          local_6c = commission_handshake_secret(in_stack_ffffffffffffff00);
          if (local_6c != 0) goto LAB_0011b20a;
        }
        local_6c = push_change_cipher_spec
                             ((ptls_t *)in_stack_ffffffffffffff30.base,
                              (ptls_message_emitter_t *)tls_00);
        iVar5 = (int)((ulong)tls_00 >> 0x20);
        if (local_6c == 0) {
          if (local_18[0x35] != 0) {
            if ((*(byte *)(local_18 + 0x2c) >> 1 & 1) != 0) {
              local_6c = 0x2f;
              goto LAB_0011b20a;
            }
            context.len = in_stack_00000108;
            context.base = (uint8_t *)message.len;
            local_6c = send_certificate_and_certificate_verify
                                 ((ptls_t *)message.base,(ptls_message_emitter_t *)tls,
                                  (st_ptls_signature_algorithms_t *)emitter,context,
                                  in_stack_000000e0,in_stack_00000120,in_stack_00000128,
                                  in_stack_00000130);
            free((void *)local_18[0x35]);
            plVar4 = local_18;
            in_stack_ffffffffffffff30 = ptls_iovec_init((void *)0x0,0);
            plVar4[0x35] = (long)in_stack_ffffffffffffff30.base;
            plVar4[0x36] = in_stack_ffffffffffffff30.len;
            if (local_6c != 0) goto LAB_0011b20a;
          }
          send_finished(in_stack_ffffffffffffff50,
                        (ptls_message_emitter_t *)in_stack_ffffffffffffff48);
          memcpy(local_18 + 0x16,local_68,0x40);
          local_6c = setup_traffic_protection
                               (in_stack_ffffffffffffff48,is_enc,
                                (char *)in_stack_ffffffffffffff30.len,
                                (size_t)in_stack_ffffffffffffff30.base,iVar5);
          if (local_6c == 0) {
            *(undefined4 *)(local_18 + 1) = 0xe;
          }
        }
      }
    }
  }
LAB_0011b20a:
  (*ptls_clear_memory)(local_68,0x40);
  return local_6c;
}

Assistant:

static int client_handle_finished(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message)
{
    uint8_t send_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = verify_finished(tls, message)) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    /* update traffic keys by using messages upto ServerFinished, but commission them after sending ClientFinished */
    if ((ret = key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 0, "s ap traffic", 3, 0)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, send_secret, "c ap traffic")) != 0)
        goto Exit;
    if ((ret = derive_exporter_secret(tls, 0)) != 0)
        goto Exit;

    /* if sending early data, emit EOED and commision the client handshake traffic secret */
    if (tls->pending_handshake_secret != NULL) {
        assert(tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL);
        if (tls->client.using_early_data && !tls->ctx->omit_end_of_early_data)
            ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA, {});
        tls->client.using_early_data = 0;
        if ((ret = commission_handshake_secret(tls)) != 0)
            goto Exit;
    }

    if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
        goto Exit;

    if (tls->client.certificate_request.context.base != NULL) {
        /* If this is a resumed session, the server must not send the certificate request in the handshake */
        if (tls->is_psk_handshake) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        ret = send_certificate_and_certificate_verify(tls, emitter, &tls->client.certificate_request.signature_algorithms,
                                                      tls->client.certificate_request.context,
                                                      PTLS_CLIENT_CERTIFICATE_VERIFY_CONTEXT_STRING, 0, NULL, 0);
        free(tls->client.certificate_request.context.base);
        tls->client.certificate_request.context = ptls_iovec_init(NULL, 0);
        if (ret != 0)
            goto Exit;
    }

    ret = send_finished(tls, emitter);

    memcpy(tls->traffic_protection.enc.secret, send_secret, sizeof(send_secret));
    if ((ret = setup_traffic_protection(tls, 1, NULL, 3, 0)) != 0)
        goto Exit;

    tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;

Exit:
    ptls_clear_memory(send_secret, sizeof(send_secret));
    return ret;
}